

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O2

MTBDD mtbdd_refs_push(MTBDD mtbdd)

{
  MTBDD *pMVar1;
  mtbdd_refs_internal_t mtbdd_refs_key;
  MTBDD *pMVar2;
  long in_FS_OFFSET;
  
  while (mtbdd_refs_key = *(mtbdd_refs_internal_t *)(in_FS_OFFSET + -0x18),
        mtbdd_refs_key == (mtbdd_refs_internal_t)0x0) {
    mtbdd_refs_init_key();
  }
  pMVar2 = mtbdd_refs_key->rcur;
  pMVar1 = pMVar2 + 1;
  mtbdd_refs_key->rcur = pMVar1;
  *pMVar2 = mtbdd;
  if (pMVar1 == mtbdd_refs_key->rend) {
    mtbdd_refs_refs_up(mtbdd_refs_key,mtbdd);
  }
  return mtbdd;
}

Assistant:

MTBDD __attribute__((unused))
mtbdd_refs_push(MTBDD mtbdd)
{
    LOCALIZE_THREAD_LOCAL(mtbdd_refs_key, mtbdd_refs_internal_t);
    if (mtbdd_refs_key == 0) {
        mtbdd_refs_init_key();
        return mtbdd_refs_push(mtbdd);
    } else {
        *(mtbdd_refs_key->rcur++) = mtbdd;
        if (mtbdd_refs_key->rcur == mtbdd_refs_key->rend) return mtbdd_refs_refs_up(mtbdd_refs_key, mtbdd);
        else return mtbdd;
    }
}